

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_context_randomize(secp256k1_context *ctx,uchar *seed32)

{
  int iVar1;
  char *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  uchar *in_stack_00000178;
  secp256k1_ecmult_gen_context *in_stack_00000180;
  undefined4 local_4;
  
  iVar1 = secp256k1_context_is_proper((secp256k1_context *)0x1048a7);
  if (iVar1 == 0) {
    secp256k1_callback_call((secp256k1_callback *)in_RDI,in_RSI);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
    if (iVar1 != 0) {
      secp256k1_ecmult_gen_blind(in_stack_00000180,in_stack_00000178);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_context_randomize(secp256k1_context* ctx, const unsigned char *seed32) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    if (secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)) {
        secp256k1_ecmult_gen_blind(&ctx->ecmult_gen_ctx, seed32);
    }
    return 1;
}